

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block_member
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint index;
  pointer pcVar1;
  size_t sVar2;
  uint *puVar3;
  CompilerGLSL *pCVar4;
  ulong uVar5;
  SPIRType *type_00;
  string *psVar6;
  ulong uVar7;
  long lVar8;
  string backup_name;
  string flattened_name;
  string member_name;
  allocator local_c9;
  CompilerGLSL *local_c8;
  string local_c0;
  string local_a0;
  char *local_80;
  SmallVector<unsigned_int,_8UL> *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  uVar7 = (ulong)(type->super_IVariant).self.id;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  pcVar1 = (basename->_M_dataplus)._M_p;
  local_c8 = this;
  local_80 = qual;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + basename->_M_string_length);
  sVar2 = (indices->super_VectorView<unsigned_int>).buffer_size;
  local_78 = indices;
  if (sVar2 == 0) {
    type_00 = (SPIRType *)0x0;
  }
  else {
    puVar3 = (indices->super_VectorView<unsigned_int>).ptr;
    lVar8 = 0;
    do {
      type_00 = type;
      ::std::__cxx11::string::append((char *)&local_a0);
      pCVar4 = local_c8;
      to_member_name_abi_cxx11_(&local_c0,local_c8,type_00,*(uint32_t *)((long)puVar3 + lVar8));
      ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      uVar7 = (ulong)(type_00->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                     [*(uint *)((long)puVar3 + lVar8)].id;
      type = Variant::get<spirv_cross::SPIRType>
                       ((pCVar4->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        uVar7);
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
  }
  pCVar4 = local_c8;
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    __assert_fail("member_type->basetype != SPIRType::Struct",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x8a9,
                  "void spirv_cross::CompilerGLSL::emit_flattened_io_block_member(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
                 );
  }
  uVar5 = (ulong)(type_00->type_alias).id;
  if (uVar5 != 0) {
    type_00 = Variant::get<spirv_cross::SPIRType>
                        ((local_c8->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                         ptr + uVar5);
  }
  ParsedIR::sanitize_underscores(&local_a0);
  index = (local_78->super_VectorView<unsigned_int>).ptr
          [(local_78->super_VectorView<unsigned_int>).buffer_size - 1];
  psVar6 = Compiler::get_member_name_abi_cxx11_
                     (&pCVar4->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index);
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + psVar6->_M_string_length);
  pCVar4 = local_c8;
  to_member_name_abi_cxx11_(&local_50,local_c8,type_00,index);
  Compiler::set_member_name
            (&pCVar4->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index,&local_a0);
  ::std::__cxx11::string::string((string *)local_70,local_80,&local_c9);
  (*(local_c8->super_Compiler)._vptr_Compiler[0x15])(local_c8,type_00,uVar7,(ulong)index,local_70,0)
  ;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  Compiler::set_member_name
            (&local_c8->super_Compiler,(TypeID)(type_00->super_IVariant).self.id,index,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_member(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	uint32_t member_type_id = type.self;
	const SPIRType *member_type = &type;
	const SPIRType *parent_type = nullptr;
	auto flattened_name = basename;
	for (auto &index : indices)
	{
		flattened_name += "_";
		flattened_name += to_member_name(*member_type, index);
		parent_type = member_type;
		member_type_id = member_type->member_types[index];
		member_type = &get<SPIRType>(member_type_id);
	}

	assert(member_type->basetype != SPIRType::Struct);

	// We're overriding struct member names, so ensure we do so on the primary type.
	if (parent_type->type_alias)
		parent_type = &get<SPIRType>(parent_type->type_alias);

	// Sanitize underscores because joining the two identifiers might create more than 1 underscore in a row,
	// which is not allowed.
	ParsedIR::sanitize_underscores(flattened_name);

	uint32_t last_index = indices.back();

	// Pass in the varying qualifier here so it will appear in the correct declaration order.
	// Replace member name while emitting it so it encodes both struct name and member name.
	auto backup_name = get_member_name(parent_type->self, last_index);
	auto member_name = to_member_name(*parent_type, last_index);
	set_member_name(parent_type->self, last_index, flattened_name);
	emit_struct_member(*parent_type, member_type_id, last_index, qual);
	// Restore member name.
	set_member_name(parent_type->self, last_index, member_name);
}